

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_broadcast(lws_context_per_thread *pt,int reason,void *in,size_t len)

{
  lws *plVar1;
  int iVar2;
  lws_protocols *plVar3;
  int iVar4;
  lws_vhost *plVar5;
  int iVar6;
  
  plVar1 = pt->fake_wsi;
  plVar5 = pt->context->vhost_list;
  (plVar1->a).protocol = (lws_protocols *)0x0;
  (plVar1->a).opaque_user_data = (void *)0x0;
  (plVar1->a).context = (lws_context *)0x0;
  (plVar1->a).vhost = (lws_vhost *)0x0;
  (plVar1->a).context = pt->context;
  iVar4 = 0;
  for (; plVar5 != (lws_vhost *)0x0; plVar5 = plVar5->vhost_next) {
    plVar3 = plVar5->protocols;
    (plVar1->a).vhost = plVar5;
    for (iVar6 = 0; iVar6 < plVar5->count_protocols; iVar6 = iVar6 + 1) {
      (plVar1->a).protocol = plVar3;
      if (plVar3->callback != (lws_callback_function *)0x0) {
        iVar2 = (*plVar3->callback)(plVar1,reason,(void *)0x0,in,len);
        if (iVar2 != 0) {
          iVar4 = 1;
        }
      }
      plVar3 = plVar3 + 1;
    }
  }
  return iVar4;
}

Assistant:

int
lws_broadcast(struct lws_context_per_thread *pt, int reason, void *in, size_t len)
{
	struct lws_vhost *v = pt->context->vhost_list;
	lws_fakewsi_def_plwsa(pt);
	int n, ret = 0;

	lws_fakewsi_prep_plwsa_ctx(pt->context);
#if !defined(LWS_PLAT_FREERTOS) && LWS_MAX_SMP > 1
	((struct lws *)plwsa)->tsi = (char)(int)(pt - &pt->context->pt[0]);
#endif

	while (v) {
		const struct lws_protocols *p = v->protocols;

		plwsa->vhost = v; /* not a real bound wsi */

		for (n = 0; n < v->count_protocols; n++) {
			plwsa->protocol = p;
			if (p->callback &&
			    p->callback((struct lws *)plwsa, (enum lws_callback_reasons)reason, NULL, in, len))
				ret |= 1;
			p++;
		}

		v = v->vhost_next;
	}

	return ret;
}